

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

int prf_array_find_ptr(void *id,void *elem)

{
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (*(uint *)((long)id + -4) >> 4 == uVar1) {
      return -1;
    }
    if (*(void **)((long)id + uVar1 * 8) == elem) break;
    uVar1 = uVar1 + 1;
  }
  return (int)uVar1;
}

Assistant:

int 
prf_array_find_ptr(void *id, void *elem)
{
  int i,n;
  void **ptr;

  n = id_to_array(id)->numelem;
  ptr = (void**)id;

  for (i = 0; i < n; i++) if (ptr[i] == elem) return i;
  return -1;
}